

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UBool __thiscall icu_63::Calendar::operator==(Calendar *this,Calendar *that)

{
  UBool UVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  bool local_1d;
  UErrorCode local_1c;
  Calendar *pCStack_18;
  UErrorCode status;
  Calendar *that_local;
  Calendar *this_local;
  
  local_1c = U_ZERO_ERROR;
  pCStack_18 = that;
  that_local = this;
  iVar2 = (*(this->super_UObject)._vptr_UObject[5])(this,that);
  local_1d = false;
  if ((char)iVar2 != '\0') {
    dVar3 = getTimeInMillis(this,&local_1c);
    dVar4 = getTimeInMillis(pCStack_18,&local_1c);
    local_1d = false;
    if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
      UVar1 = ::U_SUCCESS(local_1c);
      local_1d = UVar1 != '\0';
    }
  }
  return local_1d;
}

Assistant:

UBool
Calendar::operator==(const Calendar& that) const
{
    UErrorCode status = U_ZERO_ERROR;
    return isEquivalentTo(that) &&
        getTimeInMillis(status) == that.getTimeInMillis(status) &&
        U_SUCCESS(status);
}